

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
BasicBufferCase(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                *this,Context *context,char *name,char *desc,int bufferSizeMin,int bufferSizeMax,
               int numSamples,int flags)

{
  undefined8 *puVar1;
  deUint64 *pdVar2;
  bool bVar3;
  int iVar4;
  pointer pUVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  deUint64 dVar8;
  uint uVar9;
  pointer pUVar10;
  pointer pUVar11;
  uint uVar12;
  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *__n;
  long lVar13;
  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *this_00;
  undefined1 *puVar14;
  int iVar15;
  float fVar16;
  allocator_type local_39;
  float local_38;
  float local_34;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,NODETYPE_PERFORMANCE,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicBufferCase_00d3ee38;
  this->m_dummyProgram = (ShaderProgram *)0x0;
  this->m_dummyProgramPosLoc = -1;
  this->m_bufferID = 0;
  this->m_numSamples = numSamples;
  this->m_bufferSizeMin = bufferSizeMin;
  this->m_bufferSizeMax = bufferSizeMax;
  this->m_allocateLargerBuffer = (bool)((byte)flags & 1);
  this->m_iteration = 0;
  this_00 = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             *)(long)numSamples;
  __n = this_00;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->m_iterationOrder,(size_type)this_00,&local_39);
  if (numSamples < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pUVar10 = std::
            _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
            ::_M_allocate(this_00,(size_t)__n);
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pUVar10;
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pUVar10;
  pUVar5 = pUVar10 + (long)this_00;
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar5;
  pUVar11 = pUVar10;
  if (numSamples != 0) {
    (pUVar10->duration).totalDuration = 0;
    (pUVar10->duration).fitResponseDuration = 0;
    pUVar10->bufferSize = 0;
    pUVar10->allocatedSize = 0;
    *(undefined8 *)&pUVar10->writtenSize = 0;
    puVar14 = (undefined1 *)
              ((long)&this_00[-1]._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    if (puVar14 == (undefined1 *)0x0) {
      pUVar11 = pUVar10 + 1;
    }
    else {
      pUVar11 = pUVar5;
      if (((ulong)puVar14 & 0x7ffffffffffffff) != 0) {
        lVar13 = 0x20;
        do {
          uVar6 = *(undefined8 *)pUVar10;
          uVar7 = *(undefined8 *)&pUVar10->writtenSize;
          dVar8 = (pUVar10->duration).fitResponseDuration;
          pdVar2 = (deUint64 *)((long)&(pUVar10->duration).totalDuration + lVar13);
          *pdVar2 = (pUVar10->duration).totalDuration;
          pdVar2[1] = dVar8;
          puVar1 = (undefined8 *)((long)&pUVar10->bufferSize + lVar13);
          *puVar1 = uVar6;
          puVar1[1] = uVar7;
          lVar13 = lVar13 + 0x20;
        } while ((long)this_00 * 0x20 != lVar13);
      }
    }
  }
  (this->m_results).
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pUVar11;
  this->m_useGL = true;
  this->m_bufferRandomizerTimer = 0;
  generateTwoPassRandomIterationOrder(&this->m_iterationOrder,this->m_numSamples);
  iVar4 = this->m_numSamples;
  if (0 < (long)iVar4) {
    local_34 = (float)bufferSizeMin;
    local_38 = (float)iVar4;
    bVar3 = this->m_allocateLargerBuffer;
    pUVar5 = (this->m_results).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar15 = 1;
    lVar13 = 0;
    do {
      fVar16 = floorf(((float)iVar15 / local_38) * (float)(bufferSizeMax - bufferSizeMin) + local_34
                     );
      uVar9 = (int)fVar16 + 0xfU & 0xfffffff0;
      uVar12 = (int)((float)(int)uVar9 * 1.5);
      if (bVar3 == false) {
        uVar12 = uVar9;
      }
      *(uint *)((long)&pUVar5->bufferSize + lVar13) = uVar9;
      *(uint *)((long)&pUVar5->allocatedSize + lVar13) = uVar12 + 0xf & 0xfffffff0;
      *(undefined4 *)((long)&pUVar5->writtenSize + lVar13) = 0xffffffff;
      lVar13 = lVar13 + 0x20;
      iVar15 = iVar15 + 1;
    } while ((long)iVar4 * 0x20 != lVar13);
  }
  return;
}

Assistant:

BasicBufferCase<SampleType>::BasicBufferCase (Context& context, const char* name, const char* desc, int bufferSizeMin, int bufferSizeMax, int numSamples, int flags)
	: TestCase					(context, tcu::NODETYPE_PERFORMANCE, name, desc)
	, m_dummyProgram			(DE_NULL)
	, m_dummyProgramPosLoc		(-1)
	, m_bufferID				(0)
	, m_numSamples				(numSamples)
	, m_bufferSizeMin			(bufferSizeMin)
	, m_bufferSizeMax			(bufferSizeMax)
	, m_allocateLargerBuffer	((flags & FLAG_ALLOCATE_LARGER_BUFFER) != 0)
	, m_iteration				(0)
	, m_iterationOrder			(numSamples)
	, m_results					(numSamples)
	, m_useGL					(true)
	, m_bufferRandomizerTimer	(0)
{
	// "randomize" iteration order. Deterministic, patternless
	generateTwoPassRandomIterationOrder(m_iterationOrder, m_numSamples);

	// choose buffer sizes
	for (int sampleNdx = 0; sampleNdx < m_numSamples; ++sampleNdx)
	{
		const int rawBufferSize			= (int)deFloatFloor((float)bufferSizeMin + (float)(bufferSizeMax - bufferSizeMin) * ((float)(sampleNdx + 1) / (float)m_numSamples));
		const int bufferSize			= deAlign32(rawBufferSize, 16);
		const int allocatedBufferSize	= deAlign32((m_allocateLargerBuffer) ? ((int)((float)bufferSize * 1.5f)) : (bufferSize), 16);

		m_results[sampleNdx].bufferSize		= bufferSize;
		m_results[sampleNdx].allocatedSize	= allocatedBufferSize;
		m_results[sampleNdx].writtenSize	= -1;
	}
}